

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::EnumValueDescriptorProto::IsInitialized(EnumValueDescriptorProto *this)

{
  EnumValueOptions *pEVar1;
  bool bVar2;
  
  if (((this->_has_bits_).has_bits_[0] & 2) == 0) {
LAB_002f9cbb:
    bVar2 = true;
  }
  else {
    pEVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pEVar1->_extensions_);
    if (bVar2) {
      bVar2 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                        (&pEVar1->uninterpreted_option_);
      if (bVar2) goto LAB_002f9cbb;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

void UninterpretedOption::InternalSwap(UninterpretedOption* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.InternalSwap(&other->name_);
  identifier_value_.Swap(&other->identifier_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  string_value_.Swap(&other->string_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  aggregate_value_.Swap(&other->aggregate_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(positive_int_value_, other->positive_int_value_);
  swap(negative_int_value_, other->negative_int_value_);
  swap(double_value_, other->double_value_);
}